

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::TracingServiceImpl::EmitStats
          (TracingServiceImpl *this,TracingSession *tracing_session,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  RootMessage<perfetto::protos::pbzero::TracePacket> *this_00;
  Message *msg;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> packet;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> local_190;
  TraceStats local_d0;
  
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::HeapBuffered
            (&local_190,0x1000,0x1000);
  this_00 = &local_190.msg_;
  protozero::Message::AppendVarInt<int>((Message *)this_00,3,this->uid_);
  protozero::Message::AppendVarInt<unsigned_int>((Message *)this_00,10,1);
  GetTraceStats(&local_d0,this,tracing_session);
  msg = protozero::Message::BeginNestedMessageInternal((Message *)this_00,0x23);
  protos::gen::TraceStats::Serialize(&local_d0,msg);
  protos::gen::TraceStats::~TraceStats(&local_d0);
  protozero::Message::Finalize((Message *)this_00);
  protozero::ScatteredHeapBuffer::StitchSlices(&local_1a8,&local_190.shb_);
  anon_unknown_4::SerializeAndAppendPacket(packets,&local_1a8);
  if (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  protozero::MessageArena::~MessageArena(&local_190.msg_.root_arena_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&local_190.writer_);
  protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&local_190.shb_);
  return;
}

Assistant:

void TracingServiceImpl::EmitStats(TracingSession* tracing_session,
                                   std::vector<TracePacket>* packets) {
  protozero::HeapBuffered<protos::pbzero::TracePacket> packet;
  packet->set_trusted_uid(static_cast<int32_t>(uid_));
  packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);
  GetTraceStats(tracing_session).Serialize(packet->set_trace_stats());
  SerializeAndAppendPacket(packets, packet.SerializeAsArray());
}